

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakefileDepsParser.cpp
# Opt level: O0

void skipWhitespaceAndComments(char **cur,char *end)

{
  char cVar1;
  bool bVar2;
  int c;
  char *end_local;
  char **cur_local;
  
  do {
    if (*cur == end) {
      return;
    }
    cVar1 = **cur;
    if (cVar1 == '#') {
      while( true ) {
        bVar2 = false;
        if (*cur + 1 != end) {
          bVar2 = (*cur)[1] == '\n';
        }
        if (!bVar2) break;
        *cur = *cur + 1;
      }
    }
    else if ((((cVar1 != ' ') && (cVar1 != '\t')) && (cVar1 != '\n')) && (cVar1 != '\r')) {
      return;
    }
    *cur = *cur + 1;
  } while( true );
}

Assistant:

static void skipWhitespaceAndComments(const char*& cur, const char* end) {
  for (; cur != end; ++cur) {
    int c = *cur;

    // Skip comments.
    if (c == '#') {
      // Skip to the next newline.
      while (cur + 1 != end && cur[1] == '\n')
        ++cur;
      continue;
    }

    if (c == ' ' || c == '\t' || c == '\n' || c == '\r')
      continue;

    break;
  }
}